

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::FieldMaskTree::MergeMessage
          (FieldMaskTree *this,Node *node,Message *source,MergeOptions *options,Message *destination
          )

{
  double dVar1;
  string_view v;
  string_view v_00;
  FieldDescriptor *pFVar2;
  bool bVar3;
  CppType CVar4;
  int32_t iVar5;
  uint32_t uVar6;
  int iVar7;
  Reflection *this_00;
  Reflection *this_01;
  Descriptor *this_02;
  LogMessage *pLVar8;
  Message *pMVar9;
  Message *destination_00;
  int64_t iVar10;
  uint64_t uVar11;
  EnumValueDescriptor *pEVar12;
  Message *pMVar13;
  float fVar14;
  const_iterator cVar15;
  undefined1 auVar16 [16];
  string_view sVar17;
  int local_208;
  int i_9;
  int size_9;
  int local_1e0;
  int local_1dc;
  int i_8;
  int size_8;
  int i_7;
  int size_7;
  int i_6;
  int size_6;
  int i_5;
  int size_5;
  int i_4;
  int size_4;
  int i_3;
  int size_3;
  int i_2;
  int size_2;
  int i_1;
  int size_1;
  int i;
  int size;
  string_view local_178;
  Node *local_168;
  size_t sStack_160;
  LogMessage local_150;
  Voidify local_139;
  string_view local_138;
  Node *local_128;
  size_t sStack_120;
  LogMessage local_110;
  Voidify local_f9;
  Node *local_f8;
  size_t local_f0;
  FieldDescriptor *local_e8;
  FieldDescriptor *field;
  Node *child;
  string_view field_name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>
  *kv;
  undefined1 local_b0 [8];
  const_iterator __end3;
  undefined1 local_90 [8];
  const_iterator __begin3;
  btree_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>_>
  *__range3;
  Descriptor *descriptor;
  Reflection *destination_reflection;
  Reflection *source_reflection;
  LogMessage local_48;
  Voidify local_31;
  Message *local_30;
  Message *destination_local;
  MergeOptions *options_local;
  Message *source_local;
  Node *node_local;
  FieldMaskTree *this_local;
  
  local_30 = destination;
  destination_local = (Message *)options;
  options_local = (MergeOptions *)source;
  source_local = (Message *)node;
  node_local = &this->root_;
  bVar3 = absl::lts_20250127::container_internal::
          btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
          ::empty((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
                   *)node);
  if (bVar3) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/field_mask_util.cc"
               ,0x1ae,"!node->children.empty()");
    pLVar8 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_31,pLVar8);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_48);
  }
  this_00 = Message::GetReflection((Message *)options_local);
  this_01 = Message::GetReflection(local_30);
  this_02 = Message::GetDescriptor((Message *)options_local);
  __begin3._8_8_ = source_local;
  cVar15 = absl::lts_20250127::container_internal::
           btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
           ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
                    *)source_local);
  __end3._8_8_ = cVar15.node_;
  __begin3.node_._0_4_ = cVar15.position_;
  local_90 = (undefined1  [8])__end3._8_8_;
  cVar15 = absl::lts_20250127::container_internal::
           btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
           ::end((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
                  *)__begin3._8_8_);
  local_b0 = (undefined1  [8])cVar15.node_;
  __end3.node_._0_4_ = cVar15.position_;
  do {
    bVar3 = absl::lts_20250127::container_internal::
            btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_*>
            ::operator!=((btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_*>
                          *)local_90,(const_iterator *)local_b0);
    if (!bVar3) {
      return;
    }
    field_name._M_str =
         (char *)absl::lts_20250127::container_internal::
                 btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_*>
                 ::operator*((btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_*>
                              *)local_90);
    auVar16 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)field_name._M_str);
    field_name._M_len = auVar16._8_8_;
    child = auVar16._0_8_;
    field = (FieldDescriptor *)
            std::
            unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>
            ::get((unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>
                   *)(field_name._M_str + 0x20));
    local_f8 = child;
    local_f0 = field_name._M_len;
    sVar17._M_str = (char *)field_name._M_len;
    sVar17._M_len = (size_t)child;
    local_e8 = Descriptor::FindFieldByName(this_02,sVar17);
    if (local_e8 == (FieldDescriptor *)0x0) {
      absl::lts_20250127::log_internal::LogMessage::LogMessage
                (&local_110,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/field_mask_util.cc"
                 ,0x1b7);
      pLVar8 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_110);
      pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar8,(char (*) [20])"Cannot find field \"");
      local_128 = child;
      sStack_120 = field_name._M_len;
      v_00._M_str = (char *)field_name._M_len;
      v_00._M_len = (size_t)child;
      pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar8,v_00);
      pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar8,(char (*) [14])"\" in message ");
      sVar17 = Descriptor::full_name(this_02);
      local_138 = sVar17;
      pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar8,sVar17);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_f9,pLVar8);
      absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_110);
    }
    else {
      bVar3 = absl::lts_20250127::container_internal::
              btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
              ::empty((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
                       *)field);
      if (bVar3) {
        bVar3 = FieldDescriptor::is_repeated(local_e8);
        if (bVar3) {
          bVar3 = FieldMaskUtil::MergeOptions::replace_repeated_fields
                            ((MergeOptions *)destination_local);
          if (bVar3) {
            Reflection::ClearField(this_01,local_30,local_e8);
          }
          CVar4 = FieldDescriptor::cpp_type(local_e8);
          switch(CVar4) {
          case CPPTYPE_INT32:
            size_2 = Reflection::FieldSize(this_00,(Message *)options_local,local_e8);
            for (i_2 = 0; pMVar13 = local_30, pFVar2 = local_e8, i_2 < size_2; i_2 = i_2 + 1) {
              iVar5 = Reflection::GetRepeatedInt32(this_00,(Message *)options_local,local_e8,i_2);
              Reflection::AddInt32(this_01,pMVar13,pFVar2,iVar5);
            }
            break;
          case CPPTYPE_INT64:
            size_3 = Reflection::FieldSize(this_00,(Message *)options_local,local_e8);
            for (i_3 = 0; pMVar13 = local_30, pFVar2 = local_e8, i_3 < size_3; i_3 = i_3 + 1) {
              iVar10 = Reflection::GetRepeatedInt64(this_00,(Message *)options_local,local_e8,i_3);
              Reflection::AddInt64(this_01,pMVar13,pFVar2,iVar10);
            }
            break;
          case CPPTYPE_UINT32:
            size_4 = Reflection::FieldSize(this_00,(Message *)options_local,local_e8);
            for (i_4 = 0; pMVar13 = local_30, pFVar2 = local_e8, i_4 < size_4; i_4 = i_4 + 1) {
              uVar6 = Reflection::GetRepeatedUInt32(this_00,(Message *)options_local,local_e8,i_4);
              Reflection::AddUInt32(this_01,pMVar13,pFVar2,uVar6);
            }
            break;
          case CPPTYPE_UINT64:
            size_5 = Reflection::FieldSize(this_00,(Message *)options_local,local_e8);
            for (i_5 = 0; pMVar13 = local_30, pFVar2 = local_e8, i_5 < size_5; i_5 = i_5 + 1) {
              uVar11 = Reflection::GetRepeatedUInt64(this_00,(Message *)options_local,local_e8,i_5);
              Reflection::AddUInt64(this_01,pMVar13,pFVar2,uVar11);
            }
            break;
          case CPPTYPE_DOUBLE:
            size_7 = Reflection::FieldSize(this_00,(Message *)options_local,local_e8);
            for (i_7 = 0; pMVar13 = local_30, pFVar2 = local_e8, i_7 < size_7; i_7 = i_7 + 1) {
              dVar1 = Reflection::GetRepeatedDouble(this_00,(Message *)options_local,local_e8,i_7);
              Reflection::AddDouble(this_01,pMVar13,pFVar2,dVar1);
            }
            break;
          case CPPTYPE_FLOAT:
            size_6 = Reflection::FieldSize(this_00,(Message *)options_local,local_e8);
            for (i_6 = 0; pMVar13 = local_30, pFVar2 = local_e8, i_6 < size_6; i_6 = i_6 + 1) {
              fVar14 = Reflection::GetRepeatedFloat(this_00,(Message *)options_local,local_e8,i_6);
              Reflection::AddFloat(this_01,pMVar13,pFVar2,fVar14);
            }
            break;
          case CPPTYPE_BOOL:
            size_1 = Reflection::FieldSize(this_00,(Message *)options_local,local_e8);
            for (i_1 = 0; pMVar13 = local_30, pFVar2 = local_e8, i_1 < size_1; i_1 = i_1 + 1) {
              bVar3 = Reflection::GetRepeatedBool(this_00,(Message *)options_local,local_e8,i_1);
              Reflection::AddBool(this_01,pMVar13,pFVar2,bVar3);
            }
            break;
          case CPPTYPE_ENUM:
            size_8 = Reflection::FieldSize(this_00,(Message *)options_local,local_e8);
            for (i_8 = 0; pMVar13 = local_30, pFVar2 = local_e8, i_8 < size_8; i_8 = i_8 + 1) {
              pEVar12 = Reflection::GetRepeatedEnum(this_00,(Message *)options_local,local_e8,i_8);
              Reflection::AddEnum(this_01,pMVar13,pFVar2,pEVar12);
            }
            break;
          case CPPTYPE_STRING:
            local_1dc = Reflection::FieldSize(this_00,(Message *)options_local,local_e8);
            for (local_1e0 = 0; pMVar13 = local_30, pFVar2 = local_e8, local_1e0 < local_1dc;
                local_1e0 = local_1e0 + 1) {
              Reflection::GetRepeatedString_abi_cxx11_
                        ((string *)&i_9,this_00,(Message *)options_local,local_e8,local_1e0);
              Reflection::AddString(this_01,pMVar13,pFVar2,(string *)&i_9);
              std::__cxx11::string::~string((string *)&i_9);
            }
            break;
          case CPPTYPE_MESSAGE:
            iVar7 = Reflection::FieldSize(this_00,(Message *)options_local,local_e8);
            for (local_208 = 0; local_208 < iVar7; local_208 = local_208 + 1) {
              pMVar13 = Reflection::AddMessage(this_01,local_30,local_e8,(MessageFactory *)0x0);
              pMVar9 = Reflection::GetRepeatedMessage
                                 (this_00,(Message *)options_local,local_e8,local_208);
              Message::MergeFrom(pMVar13,pMVar9);
            }
          }
        }
        else {
          CVar4 = FieldDescriptor::cpp_type(local_e8);
          switch(CVar4) {
          case CPPTYPE_INT32:
            bVar3 = Reflection::HasField(this_00,(Message *)options_local,local_e8);
            pMVar13 = local_30;
            pFVar2 = local_e8;
            if (bVar3) {
              iVar5 = Reflection::GetInt32(this_00,(Message *)options_local,local_e8);
              Reflection::SetInt32(this_01,pMVar13,pFVar2,iVar5);
            }
            else {
              Reflection::ClearField(this_01,local_30,local_e8);
            }
            break;
          case CPPTYPE_INT64:
            bVar3 = Reflection::HasField(this_00,(Message *)options_local,local_e8);
            pMVar13 = local_30;
            pFVar2 = local_e8;
            if (bVar3) {
              iVar10 = Reflection::GetInt64(this_00,(Message *)options_local,local_e8);
              Reflection::SetInt64(this_01,pMVar13,pFVar2,iVar10);
            }
            else {
              Reflection::ClearField(this_01,local_30,local_e8);
            }
            break;
          case CPPTYPE_UINT32:
            bVar3 = Reflection::HasField(this_00,(Message *)options_local,local_e8);
            pMVar13 = local_30;
            pFVar2 = local_e8;
            if (bVar3) {
              uVar6 = Reflection::GetUInt32(this_00,(Message *)options_local,local_e8);
              Reflection::SetUInt32(this_01,pMVar13,pFVar2,uVar6);
            }
            else {
              Reflection::ClearField(this_01,local_30,local_e8);
            }
            break;
          case CPPTYPE_UINT64:
            bVar3 = Reflection::HasField(this_00,(Message *)options_local,local_e8);
            pMVar13 = local_30;
            pFVar2 = local_e8;
            if (bVar3) {
              uVar11 = Reflection::GetUInt64(this_00,(Message *)options_local,local_e8);
              Reflection::SetUInt64(this_01,pMVar13,pFVar2,uVar11);
            }
            else {
              Reflection::ClearField(this_01,local_30,local_e8);
            }
            break;
          case CPPTYPE_DOUBLE:
            bVar3 = Reflection::HasField(this_00,(Message *)options_local,local_e8);
            pMVar13 = local_30;
            pFVar2 = local_e8;
            if (bVar3) {
              dVar1 = Reflection::GetDouble(this_00,(Message *)options_local,local_e8);
              Reflection::SetDouble(this_01,pMVar13,pFVar2,dVar1);
            }
            else {
              Reflection::ClearField(this_01,local_30,local_e8);
            }
            break;
          case CPPTYPE_FLOAT:
            bVar3 = Reflection::HasField(this_00,(Message *)options_local,local_e8);
            pMVar13 = local_30;
            pFVar2 = local_e8;
            if (bVar3) {
              fVar14 = Reflection::GetFloat(this_00,(Message *)options_local,local_e8);
              Reflection::SetFloat(this_01,pMVar13,pFVar2,fVar14);
            }
            else {
              Reflection::ClearField(this_01,local_30,local_e8);
            }
            break;
          case CPPTYPE_BOOL:
            bVar3 = Reflection::HasField(this_00,(Message *)options_local,local_e8);
            pMVar13 = local_30;
            pFVar2 = local_e8;
            if (bVar3) {
              bVar3 = Reflection::GetBool(this_00,(Message *)options_local,local_e8);
              Reflection::SetBool(this_01,pMVar13,pFVar2,bVar3);
            }
            else {
              Reflection::ClearField(this_01,local_30,local_e8);
            }
            break;
          case CPPTYPE_ENUM:
            bVar3 = Reflection::HasField(this_00,(Message *)options_local,local_e8);
            pMVar13 = local_30;
            pFVar2 = local_e8;
            if (bVar3) {
              pEVar12 = Reflection::GetEnum(this_00,(Message *)options_local,local_e8);
              Reflection::SetEnum(this_01,pMVar13,pFVar2,pEVar12);
            }
            else {
              Reflection::ClearField(this_01,local_30,local_e8);
            }
            break;
          case CPPTYPE_STRING:
            bVar3 = Reflection::HasField(this_00,(Message *)options_local,local_e8);
            pMVar13 = local_30;
            pFVar2 = local_e8;
            if (bVar3) {
              Reflection::GetString_abi_cxx11_
                        ((string *)&i,this_00,(Message *)options_local,local_e8);
              Reflection::SetString(this_01,pMVar13,pFVar2,(string *)&i);
              std::__cxx11::string::~string((string *)&i);
            }
            else {
              Reflection::ClearField(this_01,local_30,local_e8);
            }
            break;
          case CPPTYPE_MESSAGE:
            bVar3 = FieldMaskUtil::MergeOptions::replace_message_fields
                              ((MergeOptions *)destination_local);
            if (bVar3) {
              Reflection::ClearField(this_01,local_30,local_e8);
            }
            bVar3 = Reflection::HasField(this_00,(Message *)options_local,local_e8);
            if (bVar3) {
              pMVar13 = Reflection::MutableMessage(this_01,local_30,local_e8,(MessageFactory *)0x0);
              pMVar9 = Reflection::GetMessage
                                 (this_00,(Message *)options_local,local_e8,(MessageFactory *)0x0);
              Message::MergeFrom(pMVar13,pMVar9);
            }
          }
        }
      }
      else {
        bVar3 = FieldDescriptor::is_repeated(local_e8);
        if (!bVar3) {
          CVar4 = FieldDescriptor::cpp_type(local_e8);
          pFVar2 = field;
          if (CVar4 == CPPTYPE_MESSAGE) {
            pMVar9 = Reflection::GetMessage
                               (this_00,(Message *)options_local,local_e8,(MessageFactory *)0x0);
            pMVar13 = destination_local;
            destination_00 =
                 Reflection::MutableMessage(this_01,local_30,local_e8,(MessageFactory *)0x0);
            MergeMessage(this,(Node *)pFVar2,pMVar9,(MergeOptions *)pMVar13,destination_00);
            goto switchD_01b6062b_default;
          }
        }
        absl::lts_20250127::log_internal::LogMessage::LogMessage
                  (&local_150,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/field_mask_util.cc"
                   ,0x1bf);
        pLVar8 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_150);
        pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar8,(char (*) [8])"Field \"");
        local_168 = child;
        sStack_160 = field_name._M_len;
        v._M_str = (char *)field_name._M_len;
        v._M_len = (size_t)child;
        pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar8,v);
        pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar8,(char (*) [14])"\" in message ");
        sVar17 = Descriptor::full_name(this_02);
        local_178 = sVar17;
        pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar8,sVar17);
        pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar8,(char (*) [45])" is not a singular message field and cannot ");
        pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar8,(char (*) [17])"have sub-fields.");
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_139,pLVar8);
        absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_150);
      }
    }
switchD_01b6062b_default:
    absl::lts_20250127::container_internal::
    btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_*>
    ::operator++((btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_*>
                  *)local_90);
  } while( true );
}

Assistant:

void FieldMaskTree::MergeMessage(const Node* node, const Message& source,
                                 const FieldMaskUtil::MergeOptions& options,
                                 Message* destination) {
  ABSL_DCHECK(!node->children.empty());
  const Reflection* source_reflection = source.GetReflection();
  const Reflection* destination_reflection = destination->GetReflection();
  const Descriptor* descriptor = source.GetDescriptor();
  for (const auto& kv : node->children) {
    absl::string_view field_name = kv.first;
    const Node* child = kv.second.get();
    const FieldDescriptor* field = descriptor->FindFieldByName(field_name);
    if (field == nullptr) {
      ABSL_LOG(ERROR) << "Cannot find field \"" << field_name
                      << "\" in message " << descriptor->full_name();
      continue;
    }
    if (!child->children.empty()) {
      // Sub-paths are only allowed for singular message fields.
      if (field->is_repeated() ||
          field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
        ABSL_LOG(ERROR) << "Field \"" << field_name << "\" in message "
                        << descriptor->full_name()
                        << " is not a singular message field and cannot "
                        << "have sub-fields.";
        continue;
      }
      MergeMessage(child, source_reflection->GetMessage(source, field), options,
                   destination_reflection->MutableMessage(destination, field));
      continue;
    }
    if (!field->is_repeated()) {
      switch (field->cpp_type()) {
#define COPY_VALUE(TYPE, Name)                                              \
  case FieldDescriptor::CPPTYPE_##TYPE: {                                   \
    if (source_reflection->HasField(source, field)) {                       \
      destination_reflection->Set##Name(                                    \
          destination, field, source_reflection->Get##Name(source, field)); \
    } else {                                                                \
      destination_reflection->ClearField(destination, field);               \
    }                                                                       \
    break;                                                                  \
  }
        COPY_VALUE(BOOL, Bool)
        COPY_VALUE(INT32, Int32)
        COPY_VALUE(INT64, Int64)
        COPY_VALUE(UINT32, UInt32)
        COPY_VALUE(UINT64, UInt64)
        COPY_VALUE(FLOAT, Float)
        COPY_VALUE(DOUBLE, Double)
        COPY_VALUE(ENUM, Enum)
        COPY_VALUE(STRING, String)
#undef COPY_VALUE
        case FieldDescriptor::CPPTYPE_MESSAGE: {
          if (options.replace_message_fields()) {
            destination_reflection->ClearField(destination, field);
          }
          if (source_reflection->HasField(source, field)) {
            destination_reflection->MutableMessage(destination, field)
                ->MergeFrom(source_reflection->GetMessage(source, field));
          }
          break;
        }
      }
    } else {
      if (options.replace_repeated_fields()) {
        destination_reflection->ClearField(destination, field);
      }
      switch (field->cpp_type()) {
#define COPY_REPEATED_VALUE(TYPE, Name)                            \
  case FieldDescriptor::CPPTYPE_##TYPE: {                          \
    int size = source_reflection->FieldSize(source, field);        \
    for (int i = 0; i < size; ++i) {                               \
      destination_reflection->Add##Name(                           \
          destination, field,                                      \
          source_reflection->GetRepeated##Name(source, field, i)); \
    }                                                              \
    break;                                                         \
  }
        COPY_REPEATED_VALUE(BOOL, Bool)
        COPY_REPEATED_VALUE(INT32, Int32)
        COPY_REPEATED_VALUE(INT64, Int64)
        COPY_REPEATED_VALUE(UINT32, UInt32)
        COPY_REPEATED_VALUE(UINT64, UInt64)
        COPY_REPEATED_VALUE(FLOAT, Float)
        COPY_REPEATED_VALUE(DOUBLE, Double)
        COPY_REPEATED_VALUE(ENUM, Enum)
        COPY_REPEATED_VALUE(STRING, String)
#undef COPY_REPEATED_VALUE
        case FieldDescriptor::CPPTYPE_MESSAGE: {
          int size = source_reflection->FieldSize(source, field);
          for (int i = 0; i < size; ++i) {
            destination_reflection->AddMessage(destination, field)
                ->MergeFrom(
                    source_reflection->GetRepeatedMessage(source, field, i));
          }
          break;
        }
      }
    }
  }
}